

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>,false>
               (pair<int,_double> *begin,
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               end,int param_3,byte param_4)

{
  long lVar1;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var2;
  int __tmp;
  int iVar3;
  pair<int,_double> *ppVar4;
  int iVar5;
  pair<int,_double> *ppVar6;
  ulong uVar7;
  ulong uVar8;
  pair<int,_double> *ppVar9;
  int iVar10;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var11;
  int iVar12;
  pair<int,_double> *ppVar13;
  int __tmp_9;
  long lVar14;
  pair<int,_double> *ppVar15;
  long lVar16;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __first;
  double dVar17;
  double dVar18;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar19;
  _Iter_comp_iter<std::less<std::pair<int,_double>_>_> __cmp;
  _Iter_comp_iter<std::less<std::pair<int,_double>_>_> __cmp_1;
  _Iter_comp_iter<std::less<std::pair<int,_double>_>_> local_46;
  _Iter_comp_iter<std::less<std::pair<int,_double>_>_> local_45;
  int local_44;
  pair<int,_double> *local_40;
  ulong local_38;
  
  uVar8 = (long)end._M_current - (long)begin >> 4;
  if ((long)uVar8 < 0x18) {
    if (param_4 == 0) {
LAB_0035765c:
      ppVar4 = begin + 1;
      if (begin + 1 == end._M_current || begin == end._M_current) {
        return;
      }
      do {
        ppVar6 = ppVar4;
        iVar5 = begin->first;
        iVar3 = begin[1].first;
        if (iVar3 < iVar5) {
          dVar17 = begin[1].second;
LAB_00357688:
          do {
            do {
              ppVar4 = begin;
              ppVar4[1].first = iVar5;
              ppVar4[1].second = ppVar4->second;
              iVar5 = ppVar4[-1].first;
              begin = ppVar4 + -1;
            } while (iVar3 < iVar5);
          } while ((iVar3 <= iVar5) && (dVar17 < ppVar4[-1].second));
          ppVar4->first = iVar3;
          ppVar4->second = dVar17;
        }
        else if ((iVar3 <= iVar5) && (dVar17 = begin[1].second, dVar17 < begin->second))
        goto LAB_00357688;
        ppVar4 = ppVar6 + 1;
        begin = ppVar6;
        if (ppVar4 == end._M_current) {
          return;
        }
      } while( true );
    }
  }
  else {
    local_40 = end._M_current + -1;
    __first._M_current = begin;
    local_44 = param_3;
    do {
      uVar7 = uVar8 >> 1;
      ppVar4 = __first._M_current + uVar7;
      if (uVar8 < 0x81) {
        iVar3 = (__first._M_current)->first;
        iVar5 = ppVar4->first;
        if (iVar3 < iVar5) {
          dVar17 = ppVar4->second;
          dVar18 = (__first._M_current)->second;
LAB_00356cb1:
          ppVar4->first = iVar3;
          (__first._M_current)->first = iVar5;
          ppVar4->second = dVar18;
          (__first._M_current)->second = dVar17;
          iVar3 = iVar5;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = (__first._M_current)->second;
          dVar17 = ppVar4->second;
          if (dVar18 < dVar17) goto LAB_00356cb1;
        }
        iVar5 = local_40->first;
        if (iVar5 < iVar3) {
          dVar17 = (__first._M_current)->second;
          dVar18 = end._M_current[-1].second;
LAB_00356d2a:
          (__first._M_current)->first = iVar5;
          end._M_current[-1].first = iVar3;
          (__first._M_current)->second = dVar18;
          end._M_current[-1].second = dVar17;
          iVar3 = (__first._M_current)->first;
        }
        else if (iVar5 <= iVar3) {
          dVar18 = end._M_current[-1].second;
          dVar17 = (__first._M_current)->second;
          if (dVar18 < dVar17) goto LAB_00356d2a;
        }
        iVar5 = ppVar4->first;
        if (iVar3 < iVar5) {
          dVar17 = ppVar4->second;
          dVar18 = (__first._M_current)->second;
LAB_00356da7:
          ppVar4->first = iVar3;
          (__first._M_current)->first = iVar5;
          ppVar4->second = dVar18;
          (__first._M_current)->second = dVar17;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = (__first._M_current)->second;
          dVar17 = ppVar4->second;
          if (dVar18 < dVar17) goto LAB_00356da7;
        }
      }
      else {
        iVar3 = ppVar4->first;
        iVar5 = (__first._M_current)->first;
        if (iVar3 < iVar5) {
          dVar17 = (__first._M_current)->second;
          dVar18 = ppVar4->second;
LAB_00356c87:
          (__first._M_current)->first = iVar3;
          ppVar4->first = iVar5;
          (__first._M_current)->second = dVar18;
          ppVar4->second = dVar17;
          iVar3 = iVar5;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = ppVar4->second;
          dVar17 = (__first._M_current)->second;
          if (dVar18 < dVar17) goto LAB_00356c87;
        }
        iVar5 = local_40->first;
        if (iVar5 < iVar3) {
          dVar17 = ppVar4->second;
          dVar18 = end._M_current[-1].second;
LAB_00356cec:
          ppVar4->first = iVar5;
          end._M_current[-1].first = iVar3;
          ppVar4->second = dVar18;
          end._M_current[-1].second = dVar17;
          iVar3 = ppVar4->first;
        }
        else if (iVar5 <= iVar3) {
          dVar18 = end._M_current[-1].second;
          dVar17 = ppVar4->second;
          if (dVar18 < dVar17) goto LAB_00356cec;
        }
        iVar5 = (__first._M_current)->first;
        if (iVar3 < iVar5) {
          dVar17 = (__first._M_current)->second;
          dVar18 = ppVar4->second;
LAB_00356d6c:
          (__first._M_current)->first = iVar3;
          ppVar4->first = iVar5;
          (__first._M_current)->second = dVar18;
          ppVar4->second = dVar17;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = ppVar4->second;
          dVar17 = (__first._M_current)->second;
          if (dVar18 < dVar17) goto LAB_00356d6c;
        }
        ppVar6 = __first._M_current + (uVar7 - 1);
        iVar3 = ppVar6->first;
        iVar5 = __first._M_current[1].first;
        if (iVar3 < iVar5) {
          dVar17 = __first._M_current[1].second;
          dVar18 = __first._M_current[uVar7 - 1].second;
LAB_00356df1:
          __first._M_current[1].first = iVar3;
          ppVar6->first = iVar5;
          __first._M_current[1].second = dVar18;
          __first._M_current[uVar7 - 1].second = dVar17;
          iVar3 = iVar5;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = __first._M_current[uVar7 - 1].second;
          dVar17 = __first._M_current[1].second;
          if (dVar18 < dVar17) goto LAB_00356df1;
        }
        iVar5 = end._M_current[-2].first;
        if (iVar5 < iVar3) {
          dVar17 = __first._M_current[uVar7 - 1].second;
          dVar18 = end._M_current[-2].second;
LAB_00356e4c:
          ppVar6->first = iVar5;
          end._M_current[-2].first = iVar3;
          __first._M_current[uVar7 - 1].second = dVar18;
          end._M_current[-2].second = dVar17;
          iVar3 = ppVar6->first;
        }
        else if (iVar5 <= iVar3) {
          dVar18 = end._M_current[-2].second;
          dVar17 = __first._M_current[uVar7 - 1].second;
          if (dVar18 < dVar17) goto LAB_00356e4c;
        }
        iVar5 = __first._M_current[1].first;
        if (iVar3 < iVar5) {
          dVar17 = __first._M_current[1].second;
          dVar18 = __first._M_current[uVar7 - 1].second;
LAB_00356e89:
          __first._M_current[1].first = iVar3;
          ppVar6->first = iVar5;
          __first._M_current[1].second = dVar18;
          __first._M_current[uVar7 - 1].second = dVar17;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = __first._M_current[uVar7 - 1].second;
          dVar17 = __first._M_current[1].second;
          if (dVar18 < dVar17) goto LAB_00356e89;
        }
        ppVar15 = __first._M_current + uVar7 + 1;
        iVar3 = ppVar15->first;
        iVar5 = __first._M_current[2].first;
        if (iVar3 < iVar5) {
          dVar17 = __first._M_current[2].second;
          dVar18 = __first._M_current[uVar7 + 1].second;
LAB_00356ed0:
          __first._M_current[2].first = iVar3;
          ppVar15->first = iVar5;
          __first._M_current[2].second = dVar18;
          __first._M_current[uVar7 + 1].second = dVar17;
          iVar3 = iVar5;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = __first._M_current[uVar7 + 1].second;
          dVar17 = __first._M_current[2].second;
          if (dVar18 < dVar17) goto LAB_00356ed0;
        }
        iVar5 = end._M_current[-3].first;
        if (iVar5 < iVar3) {
          dVar17 = __first._M_current[uVar7 + 1].second;
          dVar18 = end._M_current[-3].second;
LAB_00356f0e:
          ppVar15->first = iVar5;
          end._M_current[-3].first = iVar3;
          __first._M_current[uVar7 + 1].second = dVar18;
          end._M_current[-3].second = dVar17;
          iVar3 = ppVar15->first;
        }
        else if (iVar5 <= iVar3) {
          dVar18 = end._M_current[-3].second;
          dVar17 = __first._M_current[uVar7 + 1].second;
          if (dVar18 < dVar17) goto LAB_00356f0e;
        }
        iVar5 = __first._M_current[2].first;
        if (iVar3 < iVar5) {
          dVar17 = __first._M_current[2].second;
          dVar18 = __first._M_current[uVar7 + 1].second;
LAB_00356f4b:
          __first._M_current[2].first = iVar3;
          ppVar15->first = iVar5;
          __first._M_current[2].second = dVar18;
          __first._M_current[uVar7 + 1].second = dVar17;
          iVar3 = iVar5;
        }
        else if (iVar3 <= iVar5) {
          dVar18 = __first._M_current[uVar7 + 1].second;
          dVar17 = __first._M_current[2].second;
          if (dVar18 < dVar17) goto LAB_00356f4b;
        }
        iVar5 = ppVar4->first;
        iVar12 = ppVar6->first;
        if (iVar5 < iVar12) {
          dVar17 = __first._M_current[uVar7 - 1].second;
          dVar18 = ppVar4->second;
LAB_00356f8b:
          ppVar6->first = iVar5;
          ppVar4->first = iVar12;
          __first._M_current[uVar7 - 1].second = dVar18;
          ppVar4->second = dVar17;
          iVar10 = iVar12;
          iVar12 = iVar5;
        }
        else {
          iVar10 = iVar5;
          if (iVar5 <= iVar12) {
            dVar18 = ppVar4->second;
            dVar17 = __first._M_current[uVar7 - 1].second;
            if (dVar18 < dVar17) goto LAB_00356f8b;
          }
        }
        if (iVar3 < iVar10) {
          dVar17 = ppVar4->second;
          dVar18 = __first._M_current[uVar7 + 1].second;
LAB_00356fc7:
          ppVar4->first = iVar3;
          ppVar15->first = iVar10;
          ppVar4->second = dVar18;
          __first._M_current[uVar7 + 1].second = dVar17;
          iVar10 = iVar3;
        }
        else if (iVar3 <= iVar10) {
          dVar18 = __first._M_current[uVar7 + 1].second;
          dVar17 = ppVar4->second;
          if (dVar18 < dVar17) goto LAB_00356fc7;
        }
        if (iVar10 < iVar12) {
          dVar18 = __first._M_current[uVar7 - 1].second;
          dVar17 = ppVar4->second;
LAB_00356ffb:
          ppVar6->first = iVar10;
          ppVar4->first = iVar12;
          __first._M_current[uVar7 - 1].second = dVar17;
          ppVar4->second = dVar18;
          dVar17 = dVar18;
          iVar10 = iVar12;
        }
        else {
          dVar17 = ppVar4->second;
          if ((iVar10 <= iVar12) && (dVar18 = __first._M_current[uVar7 - 1].second, dVar17 < dVar18)
             ) goto LAB_00356ffb;
        }
        iVar5 = (__first._M_current)->first;
        (__first._M_current)->first = iVar10;
        ppVar4->first = iVar5;
        dVar18 = (__first._M_current)->second;
        (__first._M_current)->second = dVar17;
        ppVar4->second = dVar18;
      }
      if ((param_4 & 1) == 0) {
        iVar5 = (__first._M_current)->first;
        if (__first._M_current[-1].first < iVar5) goto LAB_00357057;
        if (iVar5 < __first._M_current[-1].first) {
          dVar17 = (__first._M_current)->second;
        }
        else {
          dVar17 = (__first._M_current)->second;
          if (__first._M_current[-1].second <= dVar17 && dVar17 != __first._M_current[-1].second)
          goto LAB_00357057;
        }
        for (lVar1 = 0;
            (iVar3 = *(int *)((long)&local_40->first + lVar1), iVar5 < iVar3 ||
            ((iVar5 <= iVar3 && (dVar17 < *(double *)((long)&local_40->second + lVar1)))));
            lVar1 = lVar1 + -0x10) {
        }
        begin = (pair<int,_double> *)((long)&local_40->first + lVar1);
        if (lVar1 == 0) {
          _Var2._M_current = __first._M_current;
          iVar12 = iVar5;
          if (__first._M_current < begin) {
            iVar12 = __first._M_current[1].first;
            _Var11._M_current = __first._M_current;
            while (_Var2._M_current = _Var11._M_current + 1, iVar12 <= iVar5) {
              if (iVar12 < iVar5) {
                if (begin <= _Var2._M_current) break;
              }
              else if ((begin <= _Var2._M_current) || (dVar17 < _Var11._M_current[1].second)) break;
              iVar12 = _Var11._M_current[2].first;
              _Var11._M_current = _Var2._M_current;
            }
          }
        }
        else {
          iVar12 = __first._M_current[1].first;
          _Var11._M_current = __first._M_current;
          while ((_Var2._M_current = _Var11._M_current + 1, iVar12 <= iVar5 &&
                 ((iVar12 < iVar5 || (_Var11._M_current[1].second <= dVar17))))) {
            iVar12 = _Var11._M_current[2].first;
            _Var11._M_current = _Var2._M_current;
          }
        }
LAB_00357615:
        if (_Var2._M_current < begin) {
          (_Var2._M_current)->first = iVar3;
          begin->first = iVar12;
          dVar18 = (_Var2._M_current)->second;
          (_Var2._M_current)->second = begin->second;
          begin->second = dVar18;
          do {
            do {
              ppVar4 = begin;
              begin = ppVar4 + -1;
              iVar3 = begin->first;
            } while (iVar5 < iVar3);
          } while ((iVar5 <= iVar3) && (dVar17 < ppVar4[-1].second));
          do {
            ppVar4 = _Var2._M_current;
            iVar12 = ppVar4[1].first;
            _Var2._M_current = ppVar4 + 1;
            if (iVar5 < iVar12) break;
          } while ((iVar12 < iVar5) || (ppVar4[1].second <= dVar17));
          goto LAB_00357615;
        }
        (__first._M_current)->first = iVar3;
        (__first._M_current)->second = begin->second;
        begin->first = iVar5;
        begin->second = dVar17;
        begin = begin + 1;
        uVar8 = (long)end._M_current - (long)begin >> 4;
      }
      else {
LAB_00357057:
        pVar19 = partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
                           (__first._M_current,end._M_current);
        _Var2 = pVar19.first._M_current;
        uVar7 = (long)_Var2._M_current - (long)__first._M_current >> 4;
        begin = _Var2._M_current + 1;
        local_38 = (long)end._M_current - (long)begin >> 4;
        if (((long)uVar7 < (long)(uVar8 >> 3)) || ((long)local_38 < (long)(uVar8 >> 3))) {
          local_44 = local_44 + -1;
          if (local_44 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,double>>>>
                      (__first,end,&local_46);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,double>>>>
                      (__first,end,&local_45);
            return;
          }
          if (0x17 < (long)uVar7) {
            uVar8 = uVar7 >> 2;
            iVar5 = (__first._M_current)->first;
            (__first._M_current)->first = __first._M_current[uVar8].first;
            __first._M_current[uVar8].first = iVar5;
            dVar17 = (__first._M_current)->second;
            (__first._M_current)->second = __first._M_current[uVar8].second;
            __first._M_current[uVar8].second = dVar17;
            ppVar4 = _Var2._M_current + -uVar8;
            iVar5 = _Var2._M_current[-1].first;
            _Var2._M_current[-1].first = ppVar4->first;
            ppVar4->first = iVar5;
            dVar17 = _Var2._M_current[-1].second;
            _Var2._M_current[-1].second = ppVar4->second;
            ppVar4->second = dVar17;
            if (0x80 < uVar7) {
              iVar5 = __first._M_current[1].first;
              __first._M_current[1].first = __first._M_current[uVar8 + 1].first;
              __first._M_current[uVar8 + 1].first = iVar5;
              dVar17 = __first._M_current[1].second;
              __first._M_current[1].second = __first._M_current[uVar8 + 1].second;
              __first._M_current[uVar8 + 1].second = dVar17;
              iVar5 = __first._M_current[2].first;
              __first._M_current[2].first = __first._M_current[uVar8 + 2].first;
              __first._M_current[uVar8 + 2].first = iVar5;
              dVar17 = __first._M_current[2].second;
              __first._M_current[2].second = __first._M_current[uVar8 + 2].second;
              __first._M_current[uVar8 + 2].second = dVar17;
              lVar1 = -2 - uVar8;
              uVar8 = ~uVar8;
              iVar5 = _Var2._M_current[-2].first;
              _Var2._M_current[-2].first = _Var2._M_current[uVar8].first;
              _Var2._M_current[uVar8].first = iVar5;
              dVar17 = _Var2._M_current[-2].second;
              _Var2._M_current[-2].second = _Var2._M_current[uVar8].second;
              _Var2._M_current[uVar8].second = dVar17;
              iVar5 = _Var2._M_current[-3].first;
              _Var2._M_current[-3].first = _Var2._M_current[lVar1].first;
              _Var2._M_current[lVar1].first = iVar5;
              dVar17 = _Var2._M_current[-3].second;
              _Var2._M_current[-3].second = _Var2._M_current[lVar1].second;
              _Var2._M_current[lVar1].second = dVar17;
            }
          }
          if (0x17 < (long)local_38) {
            uVar8 = local_38 >> 2;
            iVar5 = _Var2._M_current[1].first;
            _Var2._M_current[1].first = _Var2._M_current[uVar8 + 1].first;
            _Var2._M_current[uVar8 + 1].first = iVar5;
            dVar17 = _Var2._M_current[1].second;
            _Var2._M_current[1].second = _Var2._M_current[uVar8 + 1].second;
            _Var2._M_current[uVar8 + 1].second = dVar17;
            ppVar4 = end._M_current + -uVar8;
            iVar5 = end._M_current[-1].first;
            end._M_current[-1].first = ppVar4->first;
            ppVar4->first = iVar5;
            dVar17 = end._M_current[-1].second;
            end._M_current[-1].second = ppVar4->second;
            ppVar4->second = dVar17;
            if (0x80 < local_38) {
              iVar5 = _Var2._M_current[2].first;
              _Var2._M_current[2].first = _Var2._M_current[uVar8 + 2].first;
              _Var2._M_current[uVar8 + 2].first = iVar5;
              dVar17 = _Var2._M_current[2].second;
              _Var2._M_current[2].second = _Var2._M_current[uVar8 + 2].second;
              _Var2._M_current[uVar8 + 2].second = dVar17;
              iVar5 = _Var2._M_current[3].first;
              _Var2._M_current[3].first = _Var2._M_current[uVar8 + 3].first;
              _Var2._M_current[uVar8 + 3].first = iVar5;
              dVar17 = _Var2._M_current[3].second;
              _Var2._M_current[3].second = _Var2._M_current[uVar8 + 3].second;
              _Var2._M_current[uVar8 + 3].second = dVar17;
              lVar1 = -2 - uVar8;
              uVar8 = ~uVar8;
              iVar5 = end._M_current[-2].first;
              end._M_current[-2].first = end._M_current[uVar8].first;
              end._M_current[uVar8].first = iVar5;
              dVar17 = end._M_current[-2].second;
              end._M_current[-2].second = end._M_current[uVar8].second;
              end._M_current[uVar8].second = dVar17;
              iVar5 = end._M_current[-3].first;
              end._M_current[-3].first = end._M_current[lVar1].first;
              end._M_current[lVar1].first = iVar5;
              dVar17 = end._M_current[-3].second;
              end._M_current[-3].second = end._M_current[lVar1].second;
              end._M_current[lVar1].second = dVar17;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__first._M_current + 1 != _Var2._M_current && __first._M_current != _Var2._M_current)
          {
            lVar1 = 0;
            uVar8 = 0;
            _Var11._M_current = __first._M_current;
            ppVar4 = __first._M_current + 1;
            do {
              iVar5 = (_Var11._M_current)->first;
              iVar3 = _Var11._M_current[1].first;
              if (iVar3 < iVar5) {
                dVar17 = (_Var11._M_current)->second;
                dVar18 = _Var11._M_current[1].second;
LAB_003570dc:
                ppVar6 = ppVar4 + -1;
                _Var11._M_current[1].first = iVar5;
                ppVar4->second = dVar17;
                _Var11._M_current = __first._M_current;
                ppVar15 = ppVar4;
                lVar14 = lVar1;
                if (ppVar6 != __first._M_current) {
                  do {
                    iVar5 = ppVar6[-1].first;
                    if (iVar3 < iVar5) {
                      dVar17 = ppVar6[-1].second;
                    }
                    else {
                      _Var11._M_current = ppVar6;
                      if (iVar5 < iVar3) {
                        ppVar15 = ppVar6 + 1;
                        break;
                      }
                      dVar17 = ppVar6[-1].second;
                      if (dVar17 <= dVar18) break;
                    }
                    ppVar6->first = iVar5;
                    ppVar6->second = dVar17;
                    lVar14 = lVar14 + 0x10;
                    _Var11._M_current = __first._M_current;
                    ppVar15 = ppVar6;
                    ppVar6 = ppVar6 + -1;
                  } while (lVar14 != 0);
                }
                (_Var11._M_current)->first = iVar3;
                ppVar15[-1].second = dVar18;
                uVar8 = uVar8 + ((long)ppVar4 - (long)_Var11._M_current >> 4);
                if (8 < uVar8) goto LAB_003574e7;
              }
              else if (iVar3 <= iVar5) {
                dVar17 = (_Var11._M_current)->second;
                dVar18 = _Var11._M_current[1].second;
                if (dVar18 < dVar17) goto LAB_003570dc;
              }
              ppVar6 = ppVar4 + 1;
              lVar1 = lVar1 + -0x10;
              _Var11._M_current = ppVar4;
              ppVar4 = ppVar6;
            } while (ppVar6 != _Var2._M_current);
          }
          if (begin == end._M_current) {
            return;
          }
          if (_Var2._M_current + 2 == end._M_current) {
            return;
          }
          lVar1 = 0x20;
          lVar14 = 0;
          uVar8 = 0;
          ppVar4 = begin;
          do {
            ppVar6 = (pair<int,_double> *)((long)&(_Var2._M_current)->first + lVar1);
            iVar5 = *(int *)((long)&(_Var2._M_current)->first + lVar1);
            iVar3 = ppVar4->first;
            if (iVar5 < iVar3) {
              dVar17 = ppVar4->second;
              dVar18 = ppVar4[1].second;
LAB_003571c5:
              ppVar6->first = iVar3;
              ppVar6->second = dVar17;
              ppVar4 = begin;
              ppVar15 = ppVar6;
              if (lVar1 != 0x20) {
                ppVar13 = (pair<int,_double> *)((long)&_Var2._M_current[-1].first + lVar1);
                lVar16 = lVar14;
                do {
                  ppVar9 = ppVar13;
                  iVar3 = ppVar9[-1].first;
                  if (iVar5 < iVar3) {
                    dVar17 = ppVar9[-1].second;
                  }
                  else {
                    ppVar4 = ppVar9;
                    if (iVar3 < iVar5) {
                      ppVar15 = ppVar9 + 1;
                      break;
                    }
                    dVar17 = ppVar9[-1].second;
                    if (dVar17 <= dVar18) break;
                  }
                  ppVar9->first = iVar3;
                  ppVar9->second = dVar17;
                  lVar16 = lVar16 + 0x10;
                  ppVar13 = ppVar9 + -1;
                  ppVar4 = begin;
                  ppVar15 = ppVar9;
                } while (lVar16 != 0);
              }
              ppVar4->first = iVar5;
              ppVar15[-1].second = dVar18;
              uVar8 = uVar8 + ((long)ppVar6 - (long)ppVar4 >> 4);
              if (8 < uVar8) break;
            }
            else if (iVar5 <= iVar3) {
              dVar17 = ppVar4->second;
              dVar18 = ppVar4[1].second;
              if (dVar18 < dVar17) goto LAB_003571c5;
            }
            ppVar15 = (pair<int,_double> *)((long)&_Var2._M_current[1].first + lVar1);
            lVar1 = lVar1 + 0x10;
            lVar14 = lVar14 + -0x10;
            ppVar4 = ppVar6;
            if (ppVar15 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_003574e7:
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>,false>
                  (__first._M_current,_Var2._M_current,local_44,param_4 & 1);
        param_4 = 0;
        uVar8 = local_38;
      }
      __first._M_current = begin;
    } while (0x17 < (long)uVar8);
    if ((param_4 & 1) == 0) goto LAB_0035765c;
  }
  if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar1 = 0;
    ppVar4 = begin;
    ppVar6 = begin + 1;
    do {
      iVar5 = ppVar4->first;
      iVar3 = ppVar4[1].first;
      if (iVar3 < iVar5) {
        dVar17 = ppVar4->second;
        dVar18 = ppVar4[1].second;
LAB_00356bbf:
        ppVar15 = ppVar6 + -1;
        ppVar4[1].first = iVar5;
        ppVar6->second = dVar17;
        ppVar4 = begin;
        ppVar13 = ppVar6;
        lVar14 = lVar1;
        if (ppVar15 != begin) {
          do {
            iVar5 = ppVar15[-1].first;
            if (iVar3 < iVar5) {
              dVar17 = ppVar15[-1].second;
            }
            else {
              ppVar4 = ppVar15;
              if (iVar5 < iVar3) {
                ppVar13 = ppVar15 + 1;
                break;
              }
              dVar17 = ppVar15[-1].second;
              if (dVar17 <= dVar18) break;
            }
            ppVar15->first = iVar5;
            ppVar15->second = dVar17;
            lVar14 = lVar14 + 0x10;
            ppVar4 = begin;
            ppVar13 = ppVar15;
            ppVar15 = ppVar15 + -1;
          } while (lVar14 != 0);
        }
        ppVar4->first = iVar3;
        ppVar13[-1].second = dVar18;
      }
      else if (iVar3 <= iVar5) {
        dVar17 = ppVar4->second;
        dVar18 = ppVar4[1].second;
        if (dVar18 < dVar17) goto LAB_00356bbf;
      }
      ppVar15 = ppVar6 + 1;
      lVar1 = lVar1 + -0x10;
      ppVar4 = ppVar6;
      ppVar6 = ppVar15;
    } while (ppVar15 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }